

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

void lua_rawset(lua_State *L,int idx)

{
  cTValue *key;
  uint64_t uVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  GCobj *o;
  GCtab *t;
  
  pTVar2 = index2adr(L,idx);
  t = (GCtab *)(pTVar2->u64 & 0x7fffffffffff);
  pTVar2 = L->top;
  key = pTVar2 + -2;
  pTVar3 = lj_tab_set(L,t,key);
  *pTVar3 = pTVar2[-1];
  if ((t->marked & 4) != 0) {
    uVar1 = (L->glref).ptr64;
    t->marked = t->marked & 0xfb;
    (t->gclist).gcptr64 = *(uint64_t *)(uVar1 + 0x40);
    *(GCtab **)(uVar1 + 0x40) = t;
  }
  L->top = key;
  return;
}

Assistant:

LUA_API void lua_rawset(lua_State *L, int idx)
{
  GCtab *t = tabV(index2adr(L, idx));
  TValue *dst, *key;
  lj_checkapi_slot(2);
  key = L->top-2;
  dst = lj_tab_set(L, t, key);
  copyTV(L, dst, key+1);
  lj_gc_anybarriert(L, t);
  L->top = key;
}